

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_app.h
# Opt level: O2

void sapp_toggle_fullscreen(void)

{
  _sapp.fullscreen = !_sapp.fullscreen;
  _sapp_x11_set_fullscreen(_sapp.fullscreen);
  _sapp_x11_query_window_size();
  return;
}

Assistant:

SOKOL_API_IMPL void sapp_toggle_fullscreen(void) {
    #if defined(_SAPP_MACOS)
    _sapp_macos_toggle_fullscreen();
    #elif defined(_SAPP_WIN32)
    _sapp_win32_toggle_fullscreen();
    #elif defined(_SAPP_UWP)
    _sapp_uwp_toggle_fullscreen();
    #elif defined(_SAPP_LINUX)
    _sapp_x11_toggle_fullscreen();
    #endif
}